

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O0

int point_mul_id_GostR3410_2001_TestParamSet
              (EC_GROUP *group,EC_POINT *r,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  long lVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  EC_POINT *in_RSI;
  EC_GROUP *in_RDI;
  BN_CTX *in_R8;
  BIGNUM *y;
  BIGNUM *x;
  uchar b_m [32];
  uchar b_y [32];
  uchar b_x [32];
  int ret;
  undefined1 local_98 [32];
  undefined1 local_78 [8];
  uchar *in_stack_ffffffffffffff90;
  uchar *in_stack_ffffffffffffff98;
  uchar *in_stack_ffffffffffffffa0;
  uchar *in_stack_ffffffffffffffa8;
  uchar *in_stack_ffffffffffffffb0;
  int local_2c;
  
  local_2c = 0;
  BN_CTX_start(in_R8);
  pBVar2 = BN_CTX_get(in_R8);
  pBVar3 = BN_CTX_get(in_R8);
  if ((((pBVar3 != (BIGNUM *)0x0) &&
       (iVar1 = EC_POINT_get_affine_coordinates(in_RDI,in_RDX,pBVar2,pBVar3,in_R8), iVar1 != 0)) &&
      (iVar1 = BN_bn2lebinpad(pBVar2,&stack0xffffffffffffffa8,0x20), iVar1 == 0x20)) &&
     ((iVar1 = BN_bn2lebinpad(pBVar3,local_78,0x20), iVar1 == 0x20 &&
      (iVar1 = BN_bn2lebinpad(in_RCX,local_98,0x20), iVar1 == 0x20)))) {
    point_mul(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
              in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    iVar1 = CRYPTO_memcmp("",&stack0xffffffffffffffa8,0x20);
    if ((iVar1 == 0) && (iVar1 = CRYPTO_memcmp("",local_78,0x20), iVar1 == 0)) {
      iVar1 = EC_POINT_set_to_infinity(in_RDI,in_RSI);
    }
    else {
      lVar4 = BN_lebin2bn(&stack0xffffffffffffffa8,0x20,pBVar2);
      if ((lVar4 == 0) || (lVar4 = BN_lebin2bn(local_78,0x20,pBVar3), lVar4 == 0))
      goto LAB_00148037;
      iVar1 = EC_POINT_set_affine_coordinates(in_RDI,in_RSI,pBVar2,pBVar3,in_R8);
    }
    if (iVar1 != 0) {
      local_2c = 1;
    }
  }
LAB_00148037:
  BN_CTX_end(in_R8);
  return local_2c;
}

Assistant:

int
    point_mul_id_GostR3410_2001_TestParamSet(const EC_GROUP *group, EC_POINT *r,
                                             const EC_POINT *q, const BIGNUM *m,
                                             BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[32];
    unsigned char b_y[32];
    unsigned char b_m[32];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 32) != 32 || BN_bn2lebinpad(y, b_y, 32) != 32 ||
        BN_bn2lebinpad(m, b_m, 32) != 32)
        goto err;
    /* do the variable scalar multiplication */
    point_mul(b_x, b_y, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 32) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 32) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 32, x) == NULL ||
            BN_lebin2bn(b_y, 32, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}